

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O0

cl_uint __thiscall CLIntercept::getRefCount(CLIntercept *this,cl_accelerator_intel accelerator)

{
  CLdispatchX *pCVar1;
  cl_accelerator_intel in_RSI;
  cl_accelerator_intel in_RDI;
  CLdispatchX *dispatchX;
  cl_uint refCount;
  cl_platform_id platform;
  string *in_stack_00000568;
  cl_platform_id in_stack_00000570;
  CLIntercept *in_stack_00000578;
  CLIntercept *in_stack_ffffffffffffffa8;
  cl_uint local_50 [5];
  allocator local_39;
  string local_38 [32];
  cl_platform_id local_18;
  cl_accelerator_intel local_10;
  
  local_10 = in_RSI;
  local_18 = getPlatform(in_stack_ffffffffffffffa8,in_RDI);
  pCVar1 = CLIntercept::dispatchX(in_stack_ffffffffffffffa8,(cl_platform_id)in_RDI);
  if (pCVar1->clGetAcceleratorInfoINTEL ==
      (_func_cl_int_cl_accelerator_intel_cl_accelerator_info_intel_size_t_void_ptr_size_t_ptr *)0x0)
  {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"clGetAcceleratorInfoINTEL",&local_39);
    getExtensionFunctionAddress(in_stack_00000578,in_stack_00000570,in_stack_00000568);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  local_50[0] = 0;
  pCVar1 = CLIntercept::dispatchX(in_stack_ffffffffffffffa8,(cl_platform_id)in_RDI);
  if (pCVar1->clGetAcceleratorInfoINTEL !=
      (_func_cl_int_cl_accelerator_intel_cl_accelerator_info_intel_size_t_void_ptr_size_t_ptr *)0x0)
  {
    (*pCVar1->clGetAcceleratorInfoINTEL)(local_10,0x4091,4,local_50,(size_t *)0x0);
  }
  return local_50[0];
}

Assistant:

inline cl_uint CLIntercept::getRefCount( cl_accelerator_intel accelerator )
{
    cl_platform_id  platform = this->getPlatform(accelerator);
    if( dispatchX(platform).clGetAcceleratorInfoINTEL == NULL )
    {
        getExtensionFunctionAddress(
            platform,
            "clGetAcceleratorInfoINTEL" );
    }

    cl_uint refCount = 0;
    const auto& dispatchX = this->dispatchX(platform);
    if( dispatchX.clGetAcceleratorInfoINTEL )
    {
        dispatchX.clGetAcceleratorInfoINTEL(
            accelerator,
            CL_ACCELERATOR_REFERENCE_COUNT_INTEL,
            sizeof(refCount),
            &refCount,
            NULL );
    }
    return refCount;
}